

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

optional<long> __thiscall ArgsManager::GetIntArg(ArgsManager *this,string *strArg)

{
  undefined1 auVar1 [12];
  long in_FS_OFFSET;
  optional<long> oVar2;
  SettingsValue value;
  SettingsValue SStack_78;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(&SStack_78,this,strArg);
  oVar2 = SettingToInt(&SStack_78);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&SStack_78.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&SStack_78.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_78.val._M_dataplus._M_p != &SStack_78.val.field_2) {
    operator_delete(SStack_78.val._M_dataplus._M_p,SStack_78.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    auVar1 = oVar2.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._0_12_;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _12_4_ = 0;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = auVar1._0_8_;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)auVar1[8];
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_3_
         = auVar1._9_3_;
    return (optional<long>)
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ArgsManager::GetIntArg(const std::string& strArg) const
{
    const common::SettingsValue value = GetSetting(strArg);
    return SettingToInt(value);
}